

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall wallet::wallet_tests::importmulti_rescan::test_method(importmulti_rescan *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CKey *this_00;
  int iVar1;
  pointer ppCVar2;
  ChainstateManager *pCVar3;
  UniValue *pUVar4;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  MockableData records;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  base_blob<256U> *pbVar5;
  Chainstate *pCVar6;
  FlatFilePos FVar7;
  CBlockFileInfo *pCVar8;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar9;
  undefined4 uVar10;
  CBlockIndex *this_01;
  iterator pvVar11;
  long *args_2;
  CBlockIndex *this_02;
  long in_FS_OFFSET;
  const_string msg;
  initializer_list<int> __l;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  const_string file;
  undefined8 in_stack_fffffffffffff718;
  undefined8 in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  undefined8 in_stack_fffffffffffff738;
  size_t in_stack_fffffffffffff740;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  CKey futureKey;
  WalletContext context;
  shared_ptr<wallet::CWallet> wallet;
  string local_808;
  undefined1 local_7e8 [32];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  UniValue response;
  UniValue local_6b8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  undefined8 local_650;
  undefined8 uStack_648;
  UniValue local_5e0 [2];
  any local_520;
  UniValue local_508;
  UniValue local_4b0;
  string local_458 [32];
  UniValue local_438;
  string local_3e0 [32];
  UniValue local_3c0;
  string local_368 [32];
  UniValue local_348;
  UniValue local_2f0;
  string local_298 [32];
  UniValue local_278;
  string local_220 [32];
  UniValue local_200;
  string local_1a8 [32];
  UniValue key;
  UniValue keys;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_d8;
  CBlock local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xc9,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xc9,"operator()","m_node.chainman");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock27,&cs_main,
             "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp\", 201, __func__, \"m_node.chainman\")->GetMutex()"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xc9,false);
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar6->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar6->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_01 = (CBlockIndex *)0x0;
  }
  else {
    this_01 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock27,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xca,false);
  pCVar3 = (val->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  FVar7 = CBlockIndex::GetBlockPos(this_01);
  pCVar8 = ::node::BlockManager::GetBlockFileInfo(&pCVar3->m_blockman,(long)FVar7.nFile);
  pCVar8->nSize = 0x8000000;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock);
  context.chain = (Chain *)0x0;
  context.scheduler = (CScheduler *)0x0;
  context.args = (ArgsManager *)0x0;
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  CKey::GetPubKey((CPubKey *)&criticalblock27,this_00);
  GetScriptForRawPubKey((CScript *)&criticalblock31,(CPubKey *)&criticalblock27);
  TestChain100Setup::CreateAndProcessBlock
            (&local_a8,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&context,
             (CScript *)&criticalblock31,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_a8.vtx);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&criticalblock31);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&context);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xcc,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xcc,"operator()","m_node.chainman");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock27,&cs_main,
             "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp\", 204, __func__, \"m_node.chainman\")->GetMutex()"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xcc,false);
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar6->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar6->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_02 = (CBlockIndex *)0x0;
  }
  else {
    this_02 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock27,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xd1,false);
  FVar7 = CBlockIndex::GetBlockPos(this_01);
  puVar9 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (val,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                      ,0xd3,"test_method","m_node.chainman");
  ::node::BlockManager::PruneOneBlockFile
            (&((puVar9->_M_t).
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman,
             FVar7.nFile);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock);
  pCVar3 = (val->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  criticalblock31.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock31.super_unique_lock._M_device._4_4_,FVar7.nFile);
  __l._M_len = 1;
  __l._M_array = (iterator)&criticalblock31;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&criticalblock27,__l,
             (less<int> *)&context,(allocator_type *)&keys);
  ::node::BlockManager::UnlinkPrunedFiles
            (&pCVar3->m_blockman,(set<int,_std::less<int>,_std::allocator<int>_> *)&criticalblock27)
  ;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &criticalblock27);
  criticalblock27.super_unique_lock._M_device =
       (mutex_type *)
       (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
       super_BasicTestingSetup.m_node.chain._M_t.
       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
       super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = this_01;
  records._M_t._M_impl._0_8_ = in_stack_fffffffffffff718;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff728;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = in_stack_fffffffffffff730;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = in_stack_fffffffffffff734;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff738;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff740;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records);
  std::
  make_shared<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)&wallet,(char (*) [1])&criticalblock27,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             0xc694e1);
  if (criticalblock31.super_unique_lock._M_device != (mutex_type *)0x0) {
    (**(code **)(((criticalblock31.super_unique_lock._M_device)->super___recursive_mutex_base).
                 _M_mutex.__align + 8))();
  }
  criticalblock31.super_unique_lock._M_device = (mutex_type *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_d8);
  CWallet::SetupLegacyScriptPubKeyMan
            (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pvVar11 = (iterator)0xdd;
  args_2 = (long *)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock31,
             &(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              cs_wallet,"wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xdd,false);
  iVar1 = this_02->nHeight;
  CBlockIndex::GetBlockHash((uint256 *)&criticalblock27,this_02);
  (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_last_block_processed_height = iVar1;
  *(mutex_type **)
   ((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
   m_last_block_processed).super_base_blob<256U>.m_data._M_elems =
       criticalblock27.super_unique_lock._M_device;
  pbVar5 = &((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_last_block_processed).super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[8] = criticalblock27.super_unique_lock._M_owns;
  (pbVar5->m_data)._M_elems[9] = criticalblock27.super_unique_lock._9_1_;
  (pbVar5->m_data)._M_elems[10] = criticalblock27.super_unique_lock._10_1_;
  (pbVar5->m_data)._M_elems[0xb] = criticalblock27.super_unique_lock._11_1_;
  (pbVar5->m_data)._M_elems[0xc] = criticalblock27.super_unique_lock._12_1_;
  (pbVar5->m_data)._M_elems[0xd] = criticalblock27.super_unique_lock._13_1_;
  (pbVar5->m_data)._M_elems[0xe] = criticalblock27.super_unique_lock._14_1_;
  (pbVar5->m_data)._M_elems[0xf] = criticalblock27.super_unique_lock._15_1_;
  *(undefined8 *)
   (((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) = local_650;
  *(undefined8 *)
   (((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) = uStack_648;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock31.super_unique_lock);
  WalletContext::WalletContext(&context);
  context.args = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                  super_BasicTestingSetup.m_args;
  AddWallet(&context,&wallet);
  keys.val._M_dataplus._M_p = (pointer)&keys.val.field_2;
  keys.val._M_string_length = 0;
  keys.val.field_2._M_local_buf[0] = '\0';
  keys.typ = VNULL;
  keys.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keys.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  keys.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniValue::setArray(&keys);
  key.val._M_dataplus._M_p = (pointer)&key.val.field_2;
  key.val._M_string_length = 0;
  key.val.field_2._M_local_buf[0] = '\0';
  key.typ = VNULL;
  key.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  key.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  key.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  UniValue::setObject(&key);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a8,"scriptPubKey",(allocator<char> *)local_7e8);
  CKey::GetPubKey((CPubKey *)&criticalblock27,this_00);
  GetScriptForRawPubKey((CScript *)&response,(CPubKey *)&criticalblock27);
  uVar10 = response.val.field_2._M_allocated_capacity._4_4_ + -0x1d;
  pUVar4 = (UniValue *)response._0_8_;
  if ((uint)response.val.field_2._M_allocated_capacity._4_4_ < 0x1d) {
    uVar10 = response.val.field_2._M_allocated_capacity._4_4_;
    pUVar4 = &response;
  }
  s.m_size._0_4_ = uVar10;
  s.m_data = (uchar *)pUVar4;
  s.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)&criticalblock31,s);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&criticalblock31);
  key_00._M_string_length = (size_type)this_01;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718;
  key_00.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
  key_00.field_2._8_4_ = in_stack_fffffffffffff730;
  key_00.field_2._12_4_ = in_stack_fffffffffffff734;
  val_03.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff740;
  val_03._0_8_ = in_stack_fffffffffffff738;
  val_03.val._M_string_length = (size_type)local_8b8;
  val_03.val.field_2._M_allocated_capacity = (size_type)local_8b0;
  val_03.val.field_2._8_8_ = local_8a8;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8a0;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)futureKey._0_8_;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)futureKey.keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)context.chain;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)context.scheduler;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.args;
  UniValue::pushKV(&key,key_00,val_03);
  UniValue::~UniValue(&local_200);
  std::__cxx11::string::~string((string *)&criticalblock31);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&response);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_220,"timestamp",(allocator<char> *)&criticalblock31);
  criticalblock27.super_unique_lock._M_device =
       (mutex_type *)((ulong)criticalblock27.super_unique_lock._M_device & 0xffffffff00000000);
  UniValue::UniValue<int,_int,_true>(&local_278,(int *)&criticalblock27);
  key_01._M_string_length = (size_type)this_01;
  key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718;
  key_01.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
  key_01.field_2._8_4_ = in_stack_fffffffffffff730;
  key_01.field_2._12_4_ = in_stack_fffffffffffff734;
  val_04.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff740;
  val_04._0_8_ = in_stack_fffffffffffff738;
  val_04.val._M_string_length = (size_type)local_8b8;
  val_04.val.field_2._M_allocated_capacity = (size_type)local_8b0;
  val_04.val.field_2._8_8_ = local_8a8;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8a0;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)futureKey._0_8_;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)futureKey.keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)context.chain;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)context.scheduler;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.args;
  UniValue::pushKV(&key,key_01,val_04);
  UniValue::~UniValue(&local_278);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,"internal",(allocator<char> *)&criticalblock27);
  criticalblock31.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock31.super_unique_lock._M_device._1_7_,1);
  UniValue::UniValue<bool,_bool,_true>(&local_2f0,(bool *)&criticalblock31);
  key_02._M_string_length = (size_type)this_01;
  key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718;
  key_02.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
  key_02.field_2._8_4_ = in_stack_fffffffffffff730;
  key_02.field_2._12_4_ = in_stack_fffffffffffff734;
  val_05.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff740;
  val_05._0_8_ = in_stack_fffffffffffff738;
  val_05.val._M_string_length = (size_type)local_8b8;
  val_05.val.field_2._M_allocated_capacity = (size_type)local_8b0;
  val_05.val.field_2._8_8_ = local_8a8;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8a0;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)futureKey._0_8_;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)futureKey.keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)context.chain;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)context.scheduler;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.args;
  UniValue::pushKV(&key,key_02,val_05);
  UniValue::~UniValue(&local_2f0);
  std::__cxx11::string::~string(local_298);
  UniValue::UniValue(&local_348,&key);
  val_00.val._M_dataplus._M_p = (pointer)this_01;
  val_00._0_8_ = in_stack_fffffffffffff718;
  val_00.val._M_string_length = in_stack_fffffffffffff728;
  val_00.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff730;
  val_00.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff734;
  val_00.val.field_2._8_8_ = in_stack_fffffffffffff738;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff740;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_8b8;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_8b0;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_8a8;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_8a0;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)futureKey._0_8_;
  UniValue::push_back(&keys,val_00);
  UniValue::~UniValue(&local_348);
  UniValue::clear(&key);
  UniValue::setObject(&key);
  GenerateRandomKey(SUB81(&futureKey,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_368,"scriptPubKey",(allocator<char> *)local_7e8);
  CKey::GetPubKey((CPubKey *)&criticalblock27,&futureKey);
  GetScriptForRawPubKey((CScript *)&response,(CPubKey *)&criticalblock27);
  uVar10 = response.val.field_2._M_allocated_capacity._4_4_ + -0x1d;
  if ((uint)response.val.field_2._M_allocated_capacity._4_4_ < 0x1d) {
    uVar10 = response.val.field_2._M_allocated_capacity._4_4_;
    response._0_8_ = &response;
  }
  s_00.m_size._0_4_ = uVar10;
  s_00.m_data = (uchar *)response._0_8_;
  s_00.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)&criticalblock31,s_00);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&criticalblock31);
  key_03._M_string_length = (size_type)this_01;
  key_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718;
  key_03.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
  key_03.field_2._8_4_ = in_stack_fffffffffffff730;
  key_03.field_2._12_4_ = in_stack_fffffffffffff734;
  val_06.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff740;
  val_06._0_8_ = in_stack_fffffffffffff738;
  val_06.val._M_string_length = (size_type)local_8b8;
  val_06.val.field_2._M_allocated_capacity = (size_type)local_8b0;
  val_06.val.field_2._8_8_ = local_8a8;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8a0;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)futureKey._0_8_;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)futureKey.keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)context.chain;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)context.scheduler;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.args;
  UniValue::pushKV(&key,key_03,val_06);
  UniValue::~UniValue(&local_3c0);
  std::__cxx11::string::~string((string *)&criticalblock31);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&response);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e0,"timestamp",(allocator<char> *)&criticalblock31);
  criticalblock27.super_unique_lock._M_device = (mutex_type *)((ulong)this_02->nTimeMax + 0x1c21);
  UniValue::UniValue<long,_long,_true>(&local_438,(long *)&criticalblock27);
  key_04._M_string_length = (size_type)this_01;
  key_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718;
  key_04.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
  key_04.field_2._8_4_ = in_stack_fffffffffffff730;
  key_04.field_2._12_4_ = in_stack_fffffffffffff734;
  val_07.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff740;
  val_07._0_8_ = in_stack_fffffffffffff738;
  val_07.val._M_string_length = (size_type)local_8b8;
  val_07.val.field_2._M_allocated_capacity = (size_type)local_8b0;
  val_07.val.field_2._8_8_ = local_8a8;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8a0;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)futureKey._0_8_;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)futureKey.keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)context.chain;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)context.scheduler;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.args;
  UniValue::pushKV(&key,key_04,val_07);
  UniValue::~UniValue(&local_438);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,"internal",(allocator<char> *)&criticalblock27);
  criticalblock31.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock31.super_unique_lock._M_device._1_7_,1);
  UniValue::UniValue<bool,_bool,_true>(&local_4b0,(bool *)&criticalblock31);
  key_05._M_string_length = (size_type)this_01;
  key_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff718;
  key_05.field_2._M_allocated_capacity = in_stack_fffffffffffff728;
  key_05.field_2._8_4_ = in_stack_fffffffffffff730;
  key_05.field_2._12_4_ = in_stack_fffffffffffff734;
  val_08.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff740;
  val_08._0_8_ = in_stack_fffffffffffff738;
  val_08.val._M_string_length = (size_type)local_8b8;
  val_08.val.field_2._M_allocated_capacity = (size_type)local_8b0;
  val_08.val.field_2._8_8_ = local_8a8;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8a0;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)futureKey._0_8_;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)futureKey.keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)context.chain;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)context.scheduler;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.args;
  UniValue::pushKV(&key,key_05,val_08);
  UniValue::~UniValue(&local_4b0);
  std::__cxx11::string::~string(local_458);
  UniValue::UniValue(&local_508,&key);
  val_01.val._M_dataplus._M_p = (pointer)this_01;
  val_01._0_8_ = in_stack_fffffffffffff718;
  val_01.val._M_string_length = in_stack_fffffffffffff728;
  val_01.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff730;
  val_01.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff734;
  val_01.val.field_2._8_8_ = in_stack_fffffffffffff738;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff740;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_8b8;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_8b0;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_8a8;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_8a0;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)futureKey._0_8_;
  UniValue::push_back(&keys,val_01);
  UniValue::~UniValue(&local_508);
  JSONRPCRequest::JSONRPCRequest((JSONRPCRequest *)&criticalblock27);
  criticalblock31.super_unique_lock._M_device = (mutex_type *)&context;
  std::any::operator=(&local_520,(WalletContext **)&criticalblock31);
  UniValue::setArray(local_5e0);
  UniValue::UniValue(&local_6b8,&keys);
  val_02.val._M_dataplus._M_p = (pointer)this_01;
  val_02._0_8_ = in_stack_fffffffffffff718;
  val_02.val._M_string_length = in_stack_fffffffffffff728;
  val_02.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff730;
  val_02.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff734;
  val_02.val.field_2._8_8_ = in_stack_fffffffffffff738;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff740;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_8b8;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_8b0;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_8a8;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_8a0;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)futureKey._0_8_;
  UniValue::push_back(local_5e0,val_02);
  UniValue::~UniValue(&local_6b8);
  importmulti();
  RPCHelpMan::HandleRequest
            (&response,(RPCHelpMan *)&criticalblock31,(JSONRPCRequest *)&criticalblock27);
  RPCHelpMan::~RPCHelpMan((RPCHelpMan *)&criticalblock31);
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)args_2;
  msg.m_begin = pvVar11;
  file.m_end = (iterator)0xfe;
  file.m_begin = (iterator)&local_8a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_8b8,msg);
  criticalblock31.super_unique_lock._M_owns = false;
  criticalblock31.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  UniValue::write_abi_cxx11_((UniValue *)local_7e8,(int)&response,(void *)0x0,0);
  tinyformat::format<int,long,long>
            (&local_808,
             (tinyformat *)
             "[{\"success\":false,\"error\":{\"code\":-1,\"message\":\"Rescan failed for key with creation timestamp %d. There was an error reading a block from time %d, which is after or within %d seconds of key creation, and could contain transactions pertaining to the key. As a result, transactions and coins using this key may not appear in the wallet. This error could be caused by pruning or data corruption (see bitcoind log for details) and could be dealt with by downloading and rescanning the relevant blocks (see -reindex option and rescanblockchain RPC).\"}},{\"success\":true}]"
             ,&stack0xfffffffffffff734,(int *)&stack0xfffffffffffff728,&TIMESTAMP_WINDOW,args_2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&criticalblock31,&stack0xfffffffffffff738,0xfe,1,2,local_7e8,"response.write()",
             &local_808,
             "tfm::format(\"[{\\\"success\\\":false,\\\"error\\\":{\\\"code\\\":-1,\\\"message\\\":\\\"Rescan failed for key with creation \" \"timestamp %d. There was an error reading a block from time %d, which is after or within %d \" \"seconds of key creation, and could contain transactions pertaining to the key. As a result, \" \"transactions and coins using this key may not appear in the wallet. This error could be caused \" \"by pruning or data corruption (see bitcoind log for details) and could be dealt with by \" \"downloading and rescanning the relevant blocks (see -reindex option and rescanblockchain \" \"RPC).\\\"}},{\\\"success\\\":true}]\", 0, oldTip->GetBlockTimeMax(), TIMESTAMP_WINDOW)"
            );
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)local_7e8);
  RemoveWallet(&context,&wallet,(optional<bool>)0x0);
  UniValue::~UniValue(&response);
  JSONRPCRequest::~JSONRPCRequest((JSONRPCRequest *)&criticalblock27);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&futureKey.keydata);
  UniValue::~UniValue(&key);
  UniValue::~UniValue(&keys);
  WalletContext::~WalletContext(&context);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(importmulti_rescan, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    CBlockIndex* oldTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());
    WITH_LOCK(::cs_main, m_node.chainman->m_blockman.GetBlockFileInfo(oldTip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    CBlockIndex* newTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());

    // Prune the older block file.
    int file_number;
    {
        LOCK(cs_main);
        file_number = oldTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify importmulti RPC returns failure for a key whose creation time is
    // before the missing block, and success for a key whose creation time is
    // after.
    {
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        wallet->SetupLegacyScriptPubKeyMan();
        WITH_LOCK(wallet->cs_wallet, wallet->SetLastBlockProcessed(newTip->nHeight, newTip->GetBlockHash()));
        WalletContext context;
        context.args = &m_args;
        AddWallet(context, wallet);
        UniValue keys;
        keys.setArray();
        UniValue key;
        key.setObject();
        key.pushKV("scriptPubKey", HexStr(GetScriptForRawPubKey(coinbaseKey.GetPubKey())));
        key.pushKV("timestamp", 0);
        key.pushKV("internal", UniValue(true));
        keys.push_back(key);
        key.clear();
        key.setObject();
        CKey futureKey = GenerateRandomKey();
        key.pushKV("scriptPubKey", HexStr(GetScriptForRawPubKey(futureKey.GetPubKey())));
        key.pushKV("timestamp", newTip->GetBlockTimeMax() + TIMESTAMP_WINDOW + 1);
        key.pushKV("internal", UniValue(true));
        keys.push_back(std::move(key));
        JSONRPCRequest request;
        request.context = &context;
        request.params.setArray();
        request.params.push_back(std::move(keys));

        UniValue response = importmulti().HandleRequest(request);
        BOOST_CHECK_EQUAL(response.write(),
            strprintf("[{\"success\":false,\"error\":{\"code\":-1,\"message\":\"Rescan failed for key with creation "
                      "timestamp %d. There was an error reading a block from time %d, which is after or within %d "
                      "seconds of key creation, and could contain transactions pertaining to the key. As a result, "
                      "transactions and coins using this key may not appear in the wallet. This error could be caused "
                      "by pruning or data corruption (see bitcoind log for details) and could be dealt with by "
                      "downloading and rescanning the relevant blocks (see -reindex option and rescanblockchain "
                      "RPC).\"}},{\"success\":true}]",
                              0, oldTip->GetBlockTimeMax(), TIMESTAMP_WINDOW));
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt);
    }
}